

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

void Png::handleError(png_structp png,char *msg)

{
  Png *this;
  string local_30;
  
  this = (Png *)png_get_error_ptr();
  string_abi_cxx11_(&local_30,this);
  fatal("Error reading input image (\"%s\"): %s",local_30._M_dataplus._M_p,msg);
}

Assistant:

[[noreturn]] static void handleError(png_structp png, char const *msg) {
		Png *self = reinterpret_cast<Png *>(png_get_error_ptr(png));

		fatal("Error reading input image (\"%s\"): %s", self->string().c_str(), msg);
	}